

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void google::protobuf::ExtensionRangeOptions_Declaration::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  ExtensionRangeOptions_Declaration *pEVar2;
  MessageLite *value;
  string *value_00;
  ExtensionRangeOptions_Declaration **v1;
  ExtensionRangeOptions_Declaration **v2;
  char *failure_msg;
  LogMessage *pLVar3;
  uint32_t *puVar4;
  Arena *pAVar5;
  uint32_t cached_has_bits;
  LogMessage local_80;
  Voidify local_69;
  ExtensionRangeOptions_Declaration *local_68;
  Nullable<const_char_*> local_60;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  ExtensionRangeOptions_Declaration *from;
  ExtensionRangeOptions_Declaration *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  ExtensionRangeOptions_Declaration *local_30;
  anon_union_32_1_493b367e_for_ExtensionRangeOptions_Declaration_3 *local_28;
  string *local_20;
  ExtensionRangeOptions_Declaration *local_18;
  anon_union_32_1_493b367e_for_ExtensionRangeOptions_Declaration_3 *local_10;
  
  local_68 = (ExtensionRangeOptions_Declaration *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (ExtensionRangeOptions_Declaration *)to_msg;
  _this = (ExtensionRangeOptions_Declaration *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::ExtensionRangeOptions_Declaration_const*>(&local_68);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::ExtensionRangeOptions_Declaration*>(&from);
  local_60 = absl::lts_20250127::log_internal::
             Check_NEImpl<google::protobuf::ExtensionRangeOptions_Declaration_const*,google::protobuf::ExtensionRangeOptions_Declaration*>
                       (v1,v2,"&from != _this");
  if (local_60 == (Nullable<const_char_*>)0x0) {
    puVar4 = internal::HasBits<1>::operator[]
                       ((HasBits<1> *)(absl_log_internal_check_op_result + 0x10),0);
    pEVar2 = from;
    uVar1 = *puVar4;
    if ((uVar1 & 0x1f) != 0) {
      if ((uVar1 & 1) != 0) {
        to_msg_local = (MessageLite *)
                       _internal_full_name_abi_cxx11_
                                 ((ExtensionRangeOptions_Declaration *)
                                  absl_log_internal_check_op_result);
        local_30 = pEVar2;
        local_28 = &pEVar2->field_0;
        puVar4 = internal::HasBits<1>::operator[](&(pEVar2->field_0)._impl_._has_bits_,0);
        value = to_msg_local;
        *puVar4 = *puVar4 | 1;
        pAVar5 = protobuf::MessageLite::GetArena((MessageLite *)pEVar2);
        internal::ArenaStringPtr::Set<>(&(pEVar2->field_0)._impl_.full_name_,(string *)value,pAVar5)
        ;
      }
      pEVar2 = from;
      if ((uVar1 & 2) != 0) {
        local_20 = _internal_type_abi_cxx11_
                             ((ExtensionRangeOptions_Declaration *)absl_log_internal_check_op_result
                             );
        local_18 = pEVar2;
        local_10 = &pEVar2->field_0;
        puVar4 = internal::HasBits<1>::operator[](&(pEVar2->field_0)._impl_._has_bits_,0);
        value_00 = local_20;
        *puVar4 = *puVar4 | 2;
        pAVar5 = protobuf::MessageLite::GetArena((MessageLite *)pEVar2);
        internal::ArenaStringPtr::Set<>(&(pEVar2->field_0)._impl_.type_,value_00,pAVar5);
      }
      if ((uVar1 & 4) != 0) {
        (from->field_0)._impl_.number_ = *(int32_t *)(absl_log_internal_check_op_result + 0x28);
      }
      if ((uVar1 & 8) != 0) {
        (from->field_0)._impl_.reserved_ = (bool)(absl_log_internal_check_op_result[0x2c] & 1);
      }
      if ((uVar1 & 0x10) != 0) {
        (from->field_0)._impl_.repeated_ = (bool)(absl_log_internal_check_op_result[0x2d] & 1);
      }
    }
    puVar4 = internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
    *puVar4 = uVar1 | *puVar4;
    internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(from->super_Message).super_MessageLite._internal_metadata_,
               (InternalMetadata *)(absl_log_internal_check_op_result + 8));
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_60);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_80,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
             ,0x12d2,failure_msg);
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_80);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_69,pLVar3);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_80);
}

Assistant:

void ExtensionRangeOptions_Declaration::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<ExtensionRangeOptions_Declaration*>(&to_msg);
  auto& from = static_cast<const ExtensionRangeOptions_Declaration&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.ExtensionRangeOptions.Declaration)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000001fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_full_name(from._internal_full_name());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_type(from._internal_type());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.number_ = from._impl_.number_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.reserved_ = from._impl_.reserved_;
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.repeated_ = from._impl_.repeated_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}